

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O2

bool __thiscall
despot::util::tinyxml::TiXmlDocument::Accept(TiXmlDocument *this,TiXmlVisitor *visitor)

{
  TiXmlNode *pTVar1;
  char cVar2;
  undefined1 uVar3;
  int iVar4;
  TiXmlNode **ppTVar5;
  
  cVar2 = (**(code **)(*(long *)visitor + 0x10))(visitor,this);
  if (cVar2 != '\0') {
    ppTVar5 = &(this->super_TiXmlNode).firstChild;
    do {
      pTVar1 = *ppTVar5;
      if (pTVar1 == (TiXmlNode *)0x0) break;
      iVar4 = (*(pTVar1->super_TiXmlBase)._vptr_TiXmlBase[0x11])(pTVar1,visitor);
      ppTVar5 = &pTVar1->next;
    } while ((char)iVar4 != '\0');
  }
  uVar3 = (**(code **)(*(long *)visitor + 0x18))(visitor,this);
  return (bool)uVar3;
}

Assistant:

bool TiXmlDocument::Accept(TiXmlVisitor* visitor) const {
	if (visitor->VisitEnter(*this)) {
		for (const TiXmlNode* node = FirstChild(); node;
			node = node->NextSibling()) {
			if (!node->Accept(visitor))
				break;
		}
	}
	return visitor->VisitExit(*this);
}